

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

ITracker * __thiscall
Catch::TestCaseTracking::ITracker::findChild(ITracker *this,NameAndLocationRef *nameAndLocation)

{
  pointer puVar1;
  bool bVar2;
  ITracker *pIVar3;
  long lVar4;
  pointer puVar5;
  pointer puVar6;
  
  puVar5 = (this->m_children).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_children).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)puVar1 - (long)puVar5 >> 5;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    puVar5 = puVar5 + 2;
    do {
      puVar6 = puVar5;
      if ((((puVar6[-2].m_ptr)->m_nameAndLocation).location.line == (nameAndLocation->location).line
          ) && (bVar2 = operator==(&(puVar6[-2].m_ptr)->m_nameAndLocation,nameAndLocation), bVar2))
      {
        puVar6 = puVar6 + -2;
        goto LAB_0014c9b5;
      }
      if ((((puVar6[-1].m_ptr)->m_nameAndLocation).location.line == (nameAndLocation->location).line
          ) && (bVar2 = operator==(&(puVar6[-1].m_ptr)->m_nameAndLocation,nameAndLocation), bVar2))
      {
        puVar6 = puVar6 + -1;
        goto LAB_0014c9b5;
      }
      if (((puVar6->m_ptr->m_nameAndLocation).location.line == (nameAndLocation->location).line) &&
         (bVar2 = operator==(&puVar6->m_ptr->m_nameAndLocation,nameAndLocation), bVar2))
      goto LAB_0014c9b5;
      if ((((puVar6[1].m_ptr)->m_nameAndLocation).location.line == (nameAndLocation->location).line)
         && (bVar2 = operator==(&(puVar6[1].m_ptr)->m_nameAndLocation,nameAndLocation), bVar2)) {
        puVar6 = puVar6 + 1;
        goto LAB_0014c9b5;
      }
      lVar4 = lVar4 + -1;
      puVar5 = puVar6 + 4;
    } while (1 < lVar4);
    puVar5 = puVar6 + 2;
  }
  lVar4 = (long)puVar1 - (long)puVar5 >> 3;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      puVar6 = puVar1;
      if ((lVar4 != 3) ||
         (((puVar5->m_ptr->m_nameAndLocation).location.line == (nameAndLocation->location).line &&
          (bVar2 = operator==(&puVar5->m_ptr->m_nameAndLocation,nameAndLocation), puVar6 = puVar5,
          bVar2)))) goto LAB_0014c9b5;
      puVar5 = puVar5 + 1;
    }
    if (((puVar5->m_ptr->m_nameAndLocation).location.line == (nameAndLocation->location).line) &&
       (bVar2 = operator==(&puVar5->m_ptr->m_nameAndLocation,nameAndLocation), puVar6 = puVar5,
       bVar2)) goto LAB_0014c9b5;
    puVar5 = puVar5 + 1;
  }
  puVar6 = puVar1;
  if (((puVar5->m_ptr->m_nameAndLocation).location.line == (nameAndLocation->location).line) &&
     (bVar2 = operator==(&puVar5->m_ptr->m_nameAndLocation,nameAndLocation), puVar6 = puVar5, !bVar2
     )) {
    puVar6 = puVar1;
  }
LAB_0014c9b5:
  if (puVar6 == (this->m_children).
                super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    pIVar3 = (ITracker *)0x0;
  }
  else {
    pIVar3 = puVar6->m_ptr;
  }
  return pIVar3;
}

Assistant:

ITracker* ITracker::findChild( NameAndLocationRef const& nameAndLocation ) {
        auto it = std::find_if(
            m_children.begin(),
            m_children.end(),
            [&nameAndLocation]( ITrackerPtr const& tracker ) {
                auto const& tnameAndLoc = tracker->nameAndLocation();
                if ( tnameAndLoc.location.line !=
                     nameAndLocation.location.line ) {
                    return false;
                }
                return tnameAndLoc == nameAndLocation;
            } );
        return ( it != m_children.end() ) ? it->get() : nullptr;
    }